

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaScript.c
# Opt level: O2

Vec_Ptr_t * Gia_ManOrderPios(Aig_Man_t *p,Gia_Man_t *pOrder)

{
  int i;
  Vec_Ptr_t *p_00;
  Gia_Obj_t *pObj;
  void *Entry;
  uint uVar1;
  int v;
  Vec_Ptr_t **ppVVar2;
  
  if (p->nObjs[2] != pOrder->vCis->nSize) {
    __assert_fail("Aig_ManCiNum(p) == Gia_ManCiNum(pOrder)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaScript.c"
                  ,0xf3,"Vec_Ptr_t *Gia_ManOrderPios(Aig_Man_t *, Gia_Man_t *)");
  }
  if (p->nObjs[3] == pOrder->vCos->nSize) {
    p_00 = Vec_PtrAlloc(p->nObjs[3] + p->nObjs[2]);
    v = 0;
    while( true ) {
      if (pOrder->nObjs <= v) {
        return p_00;
      }
      pObj = Gia_ManObj(pOrder,v);
      if (pObj == (Gia_Obj_t *)0x0) break;
      uVar1 = (uint)*(undefined8 *)pObj;
      ppVVar2 = &p->vCis;
      if (((~uVar1 & 0x9fffffff) == 0) ||
         (ppVVar2 = &p->vCos, (~uVar1 & 0x1fffffff) != 0 && (int)uVar1 < 0)) {
        i = Gia_ObjCioId(pObj);
        Entry = Vec_PtrEntry(*ppVVar2,i);
        Vec_PtrPush(p_00,Entry);
      }
      v = v + 1;
    }
    return p_00;
  }
  __assert_fail("Aig_ManCoNum(p) == Gia_ManCoNum(pOrder)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaScript.c"
                ,0xf4,"Vec_Ptr_t *Gia_ManOrderPios(Aig_Man_t *, Gia_Man_t *)");
}

Assistant:

Vec_Ptr_t * Gia_ManOrderPios( Aig_Man_t * p, Gia_Man_t * pOrder )
{
    Vec_Ptr_t * vPios;
    Gia_Obj_t * pObj;
    int i;
    assert( Aig_ManCiNum(p) == Gia_ManCiNum(pOrder) );
    assert( Aig_ManCoNum(p) == Gia_ManCoNum(pOrder) );
    vPios = Vec_PtrAlloc( Aig_ManCiNum(p) + Aig_ManCoNum(p) );
    Gia_ManForEachObj( pOrder, pObj, i )
    {
        if ( Gia_ObjIsCi(pObj) )
            Vec_PtrPush( vPios, Aig_ManCi(p, Gia_ObjCioId(pObj)) );
        else if ( Gia_ObjIsCo(pObj) )
            Vec_PtrPush( vPios, Aig_ManCo(p, Gia_ObjCioId(pObj)) );
    }
    return vPios;
}